

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_Dsd6DecomposeSingleVarOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v)

{
  int iVar1;
  word wVar2;
  int v_local;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  if ((*pTruth & 1) == 0) {
    iVar1 = Abc_Tt6Cof0IsConst0(*pTruth,v);
    if (iVar1 != 0) {
      Dau_DsdWriteString(p,"(");
      wVar2 = Abc_Tt6Cofactor1(*pTruth,v);
      *pTruth = wVar2;
      goto LAB_006345c4;
    }
  }
  else {
    iVar1 = Abc_Tt6Cof0IsConst1(*pTruth,v);
    if (iVar1 != 0) {
      Dau_DsdWriteString(p,"!(");
      wVar2 = Abc_Tt6Cofactor1(*pTruth,v);
      *pTruth = wVar2 ^ 0xffffffffffffffff;
      goto LAB_006345c4;
    }
  }
  if ((long)*pTruth < 0) {
    iVar1 = Abc_Tt6Cof1IsConst1(*pTruth,v);
    if (iVar1 != 0) {
      Dau_DsdWriteString(p,"!(!");
      wVar2 = Abc_Tt6Cofactor0(*pTruth,v);
      *pTruth = wVar2 ^ 0xffffffffffffffff;
      goto LAB_006345c4;
    }
  }
  else {
    iVar1 = Abc_Tt6Cof1IsConst0(*pTruth,v);
    if (iVar1 != 0) {
      Dau_DsdWriteString(p,"(!");
      wVar2 = Abc_Tt6Cofactor0(*pTruth,v);
      *pTruth = wVar2;
      goto LAB_006345c4;
    }
  }
  iVar1 = Abc_Tt6CofsOpposite(*pTruth,v);
  if (iVar1 == 0) {
    return 0;
  }
  Dau_DsdWriteString(p,"[");
  wVar2 = Abc_Tt6Cofactor0(*pTruth,v);
  *pTruth = wVar2;
  p->uConstMask = 1 << ((byte)p->nConsts & 0x1f) | p->uConstMask;
LAB_006345c4:
  p->nConsts = p->nConsts + 1;
  Dau_DsdWriteVar(p,pVars[v],0);
  pVars[v] = pVars[nVars + -1];
  Abc_TtSwapVars(pTruth,nVars,v,nVars + -1);
  return 1;
}

Assistant:

static inline int Dau_Dsd6DecomposeSingleVarOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v )
{
    // consider negative cofactors
    if ( pTruth[0] & 1 )
    {        
        if ( Abc_Tt6Cof0IsConst1( pTruth[0], v ) ) // !(ax)
        {
            Dau_DsdWriteString( p, "!(" );
            pTruth[0] = ~Abc_Tt6Cofactor1( pTruth[0], v );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_Tt6Cof0IsConst0( pTruth[0], v ) ) // ax
        {
            Dau_DsdWriteString( p, "(" );
            pTruth[0] = Abc_Tt6Cofactor1( pTruth[0], v );
            goto finish;            
        }
    }
    // consider positive cofactors
    if ( pTruth[0] >> 63 )
    {        
        if ( Abc_Tt6Cof1IsConst1( pTruth[0], v ) ) // !(!ax)
        {
            Dau_DsdWriteString( p, "!(!" );
            pTruth[0] = ~Abc_Tt6Cofactor0( pTruth[0], v );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_Tt6Cof1IsConst0( pTruth[0], v ) ) // !ax
        {
            Dau_DsdWriteString( p, "(!" );
            pTruth[0] = Abc_Tt6Cofactor0( pTruth[0], v );
            goto finish;            
        }
    }
    // consider equal cofactors
    if ( Abc_Tt6CofsOpposite( pTruth[0], v ) ) // [ax]
    {
        Dau_DsdWriteString( p, "[" );
        pTruth[0] = Abc_Tt6Cofactor0( pTruth[0], v );
        p->uConstMask |= (1 << p->nConsts);
        goto finish;            
    }
    return 0;

finish:
    p->nConsts++;
    Dau_DsdWriteVar( p, pVars[v], 0 );
    pVars[v] = pVars[nVars-1];
    Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
    return 1;
}